

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autonomy2.hpp
# Opt level: O2

void __thiscall Autonomy2::Autonomy2(Autonomy2 *this,ControlArbiter *a,Sender *send)

{
  TripleBuffer<Control>::TripleBuffer(&this->receivedControlBuffer);
  TripleBuffer<Autonomy2::Blob>::TripleBuffer(&this->receivedTargetBuffer);
  this->thresholdLow = 0xaf0;
  this->thresholdHigh = 0xe10;
  PIDController<float,_4>::PIDController(&this->aPID,0.0,0.0,0.0,0.5,0.0,0.0,1.0);
  PIDController<float,_4>::PIDController(&this->ePID,0.0,0.0,0.0,0.5,0.0,0.0,1.0);
  PIDController<float,_4>::PIDController(&this->tPID,0.0,0.0,0.0,0.5,0.0,0.0,1.0);
  PIDController<float,_4>::PIDController(&this->rPID,0.0,0.0,0.0,0.5,0.0,0.0,1.0);
  *(undefined8 *)((long)&(this->pidMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->pidMutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->pidMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->pidMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->pidMutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  this->arbiter = a;
  this->send = send;
  TripleBuffer<unsigned_short[60][80]>::TripleBuffer(&this->buffer);
  return;
}

Assistant:

Autonomy2(ControlArbiter &a, Sender &send) : arbiter(a), send(send), thresholdLow(2800), thresholdHigh(3600) {}